

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_remove_bulk
               (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  _Bool _Var1;
  int iVar2;
  art_t *art_00;
  art_val_t *c;
  leaf_t *plVar3;
  roaring64_bitmap_t *in_RDX;
  undefined4 *in_RSI;
  uint8_t *in_RDI;
  leaf_t *leaf_1;
  leaf_t *leaf;
  container_t *container2;
  uint8_t typecode2;
  uint16_t low16;
  uint8_t high48 [6];
  art_t *art;
  art_t *in_stack_ffffffffffffffb8;
  uint8_t type;
  art_key_chunk_t *in_stack_ffffffffffffffc0;
  container_t *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 local_26;
  uint16_t in_stack_ffffffffffffffde;
  
  split_key((uint64_t)in_stack_ffffffffffffffc0,(uint8_t *)in_stack_ffffffffffffffb8);
  if ((*(long *)(in_RSI + 2) == 0) ||
     (iVar2 = compare_high48(in_stack_ffffffffffffffc0,(art_key_chunk_t *)in_stack_ffffffffffffffb8)
     , iVar2 != 0)) {
    art_find(in_stack_ffffffffffffffb8,(art_key_chunk_t *)0x10dae0);
    plVar3 = containerptr_roaring64_bitmap_remove
                       (in_RDX,in_RDI,in_stack_ffffffffffffffde,
                        (leaf_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    *(leaf_t **)(in_RSI + 2) = plVar3;
    *in_RSI = local_26;
    *(uint16_t *)(in_RSI + 1) = in_stack_ffffffffffffffde;
  }
  else {
    art_00 = (art_t *)container_remove(in_stack_ffffffffffffffc8,
                                       (uint16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
                                       (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x28),
                                       (uint8_t *)in_stack_ffffffffffffffb8);
    if (art_00 != *(art_t **)(*(long *)(in_RSI + 2) + 8)) {
      container_free(in_stack_ffffffffffffffc0,(uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38));
      *(art_t **)(*(long *)(in_RSI + 2) + 8) = art_00;
      *(undefined1 *)(*(long *)(in_RSI + 2) + 6) = in_stack_ffffffffffffffd7;
    }
    _Var1 = container_nonzero_cardinality(in_stack_ffffffffffffffb8,'\0');
    type = (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
    if (!_Var1) {
      c = art_erase(art_00,in_stack_ffffffffffffffc0);
      container_free(c,type);
      free_leaf((leaf_t *)0x10dacf);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_remove_bulk(roaring64_bitmap_t *r,
                                  roaring64_bulk_context_t *context,
                                  uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    if (context->leaf != NULL &&
        compare_high48(context->high_bytes, high48) == 0) {
        // We're at a container with the correct high bits.
        uint8_t typecode2;
        container_t *container2 =
            container_remove(context->leaf->container, low16,
                             context->leaf->typecode, &typecode2);
        if (container2 != context->leaf->container) {
            container_free(context->leaf->container, context->leaf->typecode);
            context->leaf->container = container2;
            context->leaf->typecode = typecode2;
        }
        if (!container_nonzero_cardinality(container2, typecode2)) {
            leaf_t *leaf = (leaf_t *)art_erase(art, high48);
            container_free(container2, typecode2);
            free_leaf(leaf);
        }
    } else {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(art, high48);
        context->leaf =
            containerptr_roaring64_bitmap_remove(r, high48, low16, leaf);
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
}